

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::ArrayType::~ArrayType(ArrayType *this)

{
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__ArrayType_0016d328;
  std::__cxx11::string::_M_dispose();
  TypeEntry::~TypeEntry(&this->super_TypeEntry);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Array;
  }